

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettify.h
# Opt level: O2

size_t floaxie::prettify<16ul,char>(char *buffer,uint len,int k)

{
  uint dot_pos;
  size_t sVar1;
  uint uVar2;
  
  dot_pos = k + len;
  uVar2 = -k;
  if (dot_pos != uVar2 && SBORROW4(dot_pos,uVar2) == (int)(dot_pos + k) < 0) {
    uVar2 = dot_pos;
  }
  if (0x10 < uVar2) {
    sVar1 = print_scientific<char>(buffer,len,dot_pos);
    return sVar1;
  }
  sVar1 = print_decimal<char>(buffer,len,k);
  return sVar1;
}

Assistant:

inline std::size_t prettify(CharType* buffer, const unsigned int len, const int k) noexcept
	{
		/* v = buffer * 10 ^ k
			dot_pos is such that 10 ^ (dot_pos - 1) <= v < 10 ^ dot_pos
			this way dot_pos gives the position of the comma.
		*/
		const int dot_pos = static_cast<int>(len) + k;

		// is always positive, since dot_pos is negative only when k is negative
		const std::size_t field_width = size_t((std::max)(dot_pos, -k));

		switch (choose_format<decimal_scientific_threshold>(field_width))
		{
		case format::decimal:
			return print_decimal(buffer, len, k);

		case format::scientific:
			return print_scientific(buffer, len, dot_pos);
		}

		// never reach here
		return 0;
	}